

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::ebml_read_uint(MatroskaDemuxer *this,uint32_t *id,int64_t *num)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint uVar5;
  ulong uVar6;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  int64_t rlength;
  ostringstream ss;
  
  iVar1 = ebml_read_element_id(this,id,(int *)0x0);
  if ((-1 < iVar1) && (iVar1 = ebml_read_element_length(this,&rlength), -1 < iVar1)) {
    if (rlength - 9U < 0xfffffffffffffff8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar3 = std::operator<<((ostream *)&ss,"Invalid uint element size ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," at position ");
      std::ostream::_M_insert<long>((long)poVar3);
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 900;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_1d0 == &local_1c0) {
        puVar4[6] = local_1c0;
        puVar4[7] = uStack_1bc;
        puVar4[8] = uStack_1b8;
        puVar4[9] = uStack_1b4;
      }
      else {
        *(uint **)(puVar4 + 2) = local_1d0;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1bc,local_1c0);
      }
      *(undefined8 *)(puVar4 + 4) = local_1c8;
      local_1c0 = local_1c0 & 0xffffff00;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    iVar1 = 0;
    uVar6 = 0;
    for (uVar5 = 0; *num = uVar6, uVar5 < (uint)rlength; uVar5 = uVar5 + 1) {
      iVar2 = IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
      uVar6 = uVar6 << 8 | (long)iVar2;
    }
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_uint(uint32_t *id, int64_t *num)
{
    unsigned n = 0;
    int res;
    int64_t rlength;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&rlength)) < 0)
        return res;
    const uint64_t size = rlength;
    if (size < 1 || size > 8)
    {
        THROW(ERR_MATROSKA_PARSE, "Invalid uint element size " << size << " at position " << m_processedBytes)
    }

    /* big-endian ordening; build up number */
    *num = 0;
    while (n++ < size) *num = *num << 8 | get_byte();
    return 0;
}